

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCountOnesVecMask2(word *x0,word *x1,int fComp0,int fComp1,word *pMask,int nWords)

{
  int iVar1;
  int local_34;
  int local_30;
  int Count;
  int w;
  int nWords_local;
  word *pMask_local;
  int fComp1_local;
  int fComp0_local;
  word *x1_local;
  word *x0_local;
  
  local_34 = 0;
  if ((fComp0 == 0) && (fComp1 == 0)) {
    for (local_30 = 0; local_30 < nWords; local_30 = local_30 + 1) {
      iVar1 = Abc_TtCountOnes(pMask[local_30] & x0[local_30] & x1[local_30]);
      local_34 = iVar1 + local_34;
    }
  }
  else if ((fComp0 == 0) || (fComp1 != 0)) {
    if ((fComp0 == 0) && (fComp1 != 0)) {
      for (local_30 = 0; local_30 < nWords; local_30 = local_30 + 1) {
        iVar1 = Abc_TtCountOnes(pMask[local_30] & x0[local_30] & (x1[local_30] ^ 0xffffffffffffffff)
                               );
        local_34 = iVar1 + local_34;
      }
    }
    else {
      for (local_30 = 0; local_30 < nWords; local_30 = local_30 + 1) {
        iVar1 = Abc_TtCountOnes(pMask[local_30] & (x0[local_30] ^ 0xffffffffffffffff) &
                                (x1[local_30] ^ 0xffffffffffffffff));
        local_34 = iVar1 + local_34;
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < nWords; local_30 = local_30 + 1) {
      iVar1 = Abc_TtCountOnes(pMask[local_30] & (x0[local_30] ^ 0xffffffffffffffff) & x1[local_30]);
      local_34 = iVar1 + local_34;
    }
  }
  return local_34;
}

Assistant:

static inline int Abc_TtCountOnesVecMask2( word * x0, word * x1, int fComp0, int fComp1, word * pMask, int nWords )
{
    int w, Count = 0;
    if ( !fComp0 && !fComp1 )
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] &  x0[w] &  x1[w] );
    else if (  fComp0 && !fComp1 )
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & ~x0[w] &  x1[w] );
    else if ( !fComp0 &&  fComp1 )
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] &  x0[w] & ~x1[w] );
    else 
        for ( w = 0; w < nWords; w++ )
            Count += Abc_TtCountOnes( pMask[w] & ~x0[w] & ~x1[w] );
    return Count;
}